

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O2

double __thiscall ON_LengthValue::Length(ON_LengthValue *this,LengthUnitSystem context_unit_system)

{
  LengthUnitSystem LVar1;
  undefined7 in_register_00000031;
  double dVar2;
  double dVar3;
  
  if ((int)CONCAT71(in_register_00000031,context_unit_system) == 0) {
    dVar3 = this->m_length;
  }
  else {
    LVar1 = ON_UnitSystem::UnitSystem(&this->m_length_unit_system);
    dVar3 = this->m_length;
    if ((context_unit_system == Unset) || (LVar1 != context_unit_system)) {
      dVar2 = ON::UnitScale(&this->m_length_unit_system,context_unit_system);
      dVar3 = dVar3 * dVar2;
    }
  }
  return dVar3;
}

Assistant:

double ON_LengthValue::Length(
  ON::LengthUnitSystem context_unit_system
) const
{
  if ( ON::LengthUnitSystem::None == context_unit_system)
    return m_length;
  if ( m_length_unit_system.UnitSystem() == context_unit_system && ON::LengthUnitSystem::Unset != context_unit_system)
    return m_length;
  return m_length*ON::UnitScale(m_length_unit_system, context_unit_system);
}